

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercuryData.h
# Opt level: O1

istream * operator>>(istream *in,MercuryTimeStep<2UL> *step)

{
  istream *piVar1;
  long lVar2;
  
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)in);
  std::istream::_M_extract<double>((double *)piVar1);
  lVar2 = 0;
  do {
    std::istream::_M_extract<double>((double *)in);
    lVar2 = lVar2 + 8;
  } while (lVar2 == 8);
  lVar2 = 0;
  do {
    std::istream::_M_extract<double>((double *)in);
    lVar2 = lVar2 + 8;
  } while (lVar2 == 8);
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, MercuryTimeStep<NDIMS>& step)
{
  std::size_t i;
  in >> step.numParticles_ >> step.time_;
  
  for (i = 0; i < NDIMS; i++)
    in >> step.min_[i];
    
  for (i = 0; i < NDIMS; i++)
    in >> step.max_[i];

  return in;
}